

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

void Abc_NtkDfsSeq_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Obj_t *pNode_00;
  undefined4 local_24;
  int i;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *vNodes_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pNode), local_24 < iVar1; local_24 = local_24 + 1) {
      pNode_00 = Abc_ObjFanin(pNode,local_24);
      Abc_NtkDfsSeq_rec(pNode_00,vNodes);
    }
    Vec_PtrPush(vNodes,pNode);
  }
  return;
}

Assistant:

void Abc_NtkDfsSeq_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanin;
    int i;
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin of the node
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_NtkDfsSeq_rec( pFanin, vNodes );
    // add the node after the fanins have been added
    Vec_PtrPush( vNodes, pNode );
}